

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_ignored_stdio(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = 1;
      eval_b = (int64_t)exit_cb_called;
      if (eval_b == 1) {
        eval_a = 1;
        eval_b = (int64_t)close_cb_called;
        if (eval_b == 1) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          eval_a = 0;
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          eval_b = (int64_t)iVar1;
          if (eval_b == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar4 = "uv_loop_close(uv_default_loop())";
          pcVar3 = "0";
          uVar2 = 0x2f0;
        }
        else {
          pcVar4 = "close_cb_called";
          pcVar3 = "1";
          uVar2 = 0x2ee;
        }
      }
      else {
        pcVar4 = "exit_cb_called";
        pcVar3 = "1";
        uVar2 = 0x2ed;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x2eb;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0x2e8;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(spawn_ignored_stdio) {
  int r;

  init_process_options("spawn_helper6", exit_cb);

  options.stdio = NULL;
  options.stdio_count = 0;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}